

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::Reshape::dim_forward
          (Dim *__return_storage_ptr__,Reshape *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs
          )

{
  pointer pDVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  int iVar21;
  int iVar22;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x91,"virtual Dim cnn::Reshape::dim_forward(const vector<Dim> &) const");
  }
  iVar22 = 1;
  iVar21 = 1;
  if ((ulong)pDVar1->nd != 0) {
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f();
    uVar11 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar14);
      auVar14 = vporq_avx512f(auVar18,auVar15);
      auVar18 = vporq_avx512f(auVar18,auVar16);
      uVar5 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar14,auVar17,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pDVar1->d + uVar11));
      auVar18._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar14._4_4_;
      auVar18._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar14._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar14._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar14._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar14._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar14._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar14._28_4_;
      auVar18._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_;
      auVar18._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar14._36_4_;
      auVar18._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar14._40_4_;
      auVar18._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar14._44_4_;
      auVar18._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar14._48_4_;
      auVar18._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar14._52_4_;
      auVar18._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar14._56_4_;
      auVar18._60_4_ = (uint)(bVar7 >> 7) * auVar14._60_4_;
      uVar11 = uVar11 + 0x10;
      auVar14 = vpmulld_avx512f(auVar18,auVar19);
    } while (((ulong)pDVar1->nd + 0xf & 0x1fffffff0) != uVar11);
    auVar14 = vmovdqa32_avx512f(auVar14);
    auVar15._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar19._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar19._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar19._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar19._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar19._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar19._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar19._28_4_;
    auVar15._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar19._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar19._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar19._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar19._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar19._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar19._56_4_;
    auVar15._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar19._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    iVar21 = auVar3._0_4_;
  }
  uVar11 = (ulong)(this->to).nd;
  if (uVar11 != 0) {
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f();
    uVar10 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar14);
      auVar14 = vporq_avx512f(auVar18,auVar15);
      auVar18 = vporq_avx512f(auVar18,auVar16);
      uVar5 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar14,auVar17,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->to).d + uVar10));
      auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar14._4_4_;
      auVar20._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar14._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar14._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar14._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar14._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar14._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar14._28_4_;
      auVar20._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_;
      auVar20._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar14._36_4_;
      auVar20._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar14._40_4_;
      auVar20._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar14._44_4_;
      auVar20._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar14._48_4_;
      auVar20._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar14._52_4_;
      auVar20._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar14._56_4_;
      auVar20._60_4_ = (uint)(bVar7 >> 7) * auVar14._60_4_;
      uVar10 = uVar10 + 0x10;
      auVar14 = vpmulld_avx512f(auVar20,auVar19);
    } while ((uVar11 + 0xf & 0x1fffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar14);
    auVar16._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar19._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar19._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar19._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar19._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar19._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar19._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar19._28_4_;
    auVar16._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar16._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar19._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar16._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar19._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar16._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar19._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar16._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar19._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar16._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar19._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar16._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar19._56_4_;
    auVar16._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar19._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar16,1);
    auVar14 = vpmulld_avx512f(auVar16,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    iVar22 = auVar3._0_4_;
  }
  if (iVar21 * pDVar1->bd != iVar22 * (this->to).bd) {
    __assert_fail("xs[0].size() == to.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x92,"virtual Dim cnn::Reshape::dim_forward(const vector<Dim> &) const");
  }
  __return_storage_ptr__->bd = (this->to).bd;
  uVar5 = *(undefined8 *)((this->to).d + 2);
  uVar8 = *(undefined8 *)((this->to).d + 4);
  uVar9 = *(undefined8 *)((this->to).d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)(this->to).d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar8;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar9;
  return __return_storage_ptr__;
}

Assistant:

Dim Reshape::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  assert(xs[0].size() == to.size());
  return to;
}